

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_remove_entry
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  undefined4 uVar1;
  int iVar2;
  vm_lookup_val *pvVar3;
  vm_val_t *in_RDX;
  vm_lookup_val *in_RDI;
  vm_lookup_val *prv_entry;
  uint hashval;
  vm_val_t key;
  vm_lookup_val *entry;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  vm_lookup_val *in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb0;
  lookuptab_undo_action in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  CVmObjLookupTable *in_stack_ffffffffffffffc0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc8;
  CVmObjLookupTable *in_stack_ffffffffffffffd0;
  
  if ((getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remove_entry::desc,1);
    __cxa_guard_release(&getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (&in_stack_ffffffffffffffa8->key,
                     (uint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (CVmNativeCodeDesc *)in_RDI);
  if (iVar2 == 0) {
    CVmStack::pop((vm_val_t *)&stack0xffffffffffffffc0);
    pvVar3 = find_entry(in_stack_ffffffffffffffd0,(vm_val_t *)in_stack_ffffffffffffffc8.native_desc,
                        (uint *)in_stack_ffffffffffffffc0,
                        (vm_lookup_val **)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (pvVar3 == (vm_lookup_val *)0x0) {
      vm_val_t::set_nil(in_RDX);
    }
    else {
      uVar1 = *(undefined4 *)&(pvVar3->val).field_0x4;
      in_RDX->typ = (pvVar3->val).typ;
      *(undefined4 *)&in_RDX->field_0x4 = uVar1;
      in_RDX->val = (pvVar3->val).val;
      add_undo_rec(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->key);
      unlink_entry((CVmObjLookupTable *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa4,in_RDI);
    }
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_remove_entry(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *argc)
{
    vm_lookup_val *entry;
    vm_val_t key;
    uint hashval;
    vm_lookup_val *prv_entry;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the key */
    G_stk->pop(&key);

    /* find the entry for this key */
    entry = find_entry(vmg_ &key, &hashval, &prv_entry);

    /* if we found the entry, delete it */
    if (entry != 0)
    {
        /* the return value is the value stored at this key */
        *retval = entry->val;

        /* generate undo for the change */
        add_undo_rec(vmg_ self, LOOKUPTAB_UNDO_DEL, &key, retval);

        /* unlink the entry */
        unlink_entry(vmg_ entry, hashval, prv_entry);
    }
    else
    {
        /* not found - the return value is nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}